

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QJsonDocument __thiscall QVariant::toJsonDocument(QVariant *this)

{
  unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QJsonDocument>(in_stack_00000028);
  return (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
}

Assistant:

QJsonDocument QVariant::toJsonDocument() const
{
    return qvariant_cast<QJsonDocument>(*this);
}